

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

GetAddressInfoResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetAddressInfoRequestStruct,cfd::js::api::GetAddressInfoResponseStruct>
          (GetAddressInfoResponseStruct *__return_storage_ptr__,api *this,
          GetAddressInfoRequestStruct *request,
          function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  GetAddressInfoResponseStruct local_170;
  undefined1 local_29;
  function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
  *call_function_local;
  GetAddressInfoRequestStruct *request_local;
  GetAddressInfoResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->address;
  call_function_local =
       (function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
        *)this;
  request_local = (GetAddressInfoRequestStruct *)__return_storage_ptr__;
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
  ::operator()(&local_170,
               (function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
                *)request,(GetAddressInfoRequestStruct *)call_function_local);
  GetAddressInfoResponseStruct::operator=(__return_storage_ptr__,&local_170);
  GetAddressInfoResponseStruct::~GetAddressInfoResponseStruct(&local_170);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}